

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_BrDeleteExplicitPass_Test::InterpreterTestSuite_PC_BrDeleteExplicitPass_Test
          (InterpreterTestSuite_PC_BrDeleteExplicitPass_Test *this)

{
  InterpreterTestSuite::InterpreterTestSuite(&this->super_InterpreterTestSuite);
  (this->super_InterpreterTestSuite).super_Test._vptr_Test = (_func_int **)&PTR__Test_0033d190;
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteExplicitPass)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray(), "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete 1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);
    EXPECT_EQ(bra[0].mId.mId, 0);
}